

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_8fa95f::ProcessProductRepresentation
          (anon_unknown_dwarf_8fa95f *this,IfcProduct *el,aiNode *nd,
          vector<aiNode_*,_std::allocator<aiNode_*>_> *subnodes,ConversionData *conv)

{
  undefined1 *this_00;
  Lazy *pLVar1;
  pointer ppaVar2;
  aiNode *paVar3;
  Lazy *pLVar4;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> uVar5;
  pointer ppIVar6;
  bool bVar7;
  bool bVar8;
  uint prevMatId;
  uint uVar9;
  pointer __p;
  Lazy<Assimp::IFC::Schema_2x3::IfcProductRepresentation> *this_01;
  IfcProductRepresentation *pIVar10;
  ulong uVar11;
  pointer ppIVar12;
  IFC *pIVar13;
  IfcMappedItem *pIVar14;
  __uniq_ptr_data<aiNode,_std::default_delete<aiNode>,_true,_true> this_02;
  IfcCartesianTransformationOperator *op;
  IfcRepresentationMap *pIVar15;
  IfcRepresentation *pIVar16;
  byte bVar17;
  long lVar18;
  long lVar19;
  Lazy *this_03;
  aiMatrix4x4t<double> *paVar20;
  IfcMatrix4 *pIVar21;
  __normal_iterator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_**,_std::vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>_>
  __i;
  pointer ppIVar22;
  TempOpening *open;
  aiNode *this_04;
  Lazy *this_05;
  bool bVar23;
  byte bVar24;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> nd_1;
  long local_3e0;
  vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
  repr_ordered;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> meshes_1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> meshes;
  string local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  IfcMatrix4 msrc;
  IfcMatrix4 m;
  aiMatrix4x4t<float> local_1e8;
  aiMatrix4x4t<double> temp;
  
  bVar24 = 0;
  if (this[0xf8] == (anon_unknown_dwarf_8fa95f)0x1) {
    prevMatId = Assimp::IFC::ProcessMaterials
                          (*(uint64_t *)(this + *(long *)(*(long *)this + -0x18) + 8),0xffffffff,
                           (ConversionData *)subnodes,false);
    meshes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &meshes._M_t._M_impl.super__Rb_tree_header._M_header;
    meshes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    meshes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    meshes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    meshes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         meshes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    this_01 = Assimp::STEP::
              Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProductRepresentation>_>::Get
                        ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProductRepresentation>_>
                          *)(this + 0xf0));
    pIVar10 = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProductRepresentation>::operator->
                        (this_01);
    std::
    vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
    ::vector(&repr_ordered,
             (long)(pIVar10->Representations).
                   super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                   .
                   super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pIVar10->Representations).
                   super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                   .
                   super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&temp);
    std::
    __copy_move_a<false,__gnu_cxx::__normal_iterator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>const*,std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>>>>,__gnu_cxx::__normal_iterator<Assimp::IFC::Schema_2x3::IfcRepresentation_const**,std::vector<Assimp::IFC::Schema_2x3::IfcRepresentation_const*,std::allocator<Assimp::IFC::Schema_2x3::IfcRepresentation_const*>>>>
              ((pIVar10->Representations).
               super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
               .
               super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (pIVar10->Representations).
               super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
               .
               super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_**,_std::vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>_>
                )repr_ordered.
                 super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    ppIVar6 = repr_ordered.
              super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppIVar12 = repr_ordered.
               super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (repr_ordered.
        super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        repr_ordered.
        super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar19 = (long)repr_ordered.
                     super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)repr_ordered.
                     super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = lVar19 >> 3;
      lVar18 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar18 == 0; lVar18 = lVar18 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Assimp::IFC::Schema_2x3::IfcRepresentation_const**,std::vector<Assimp::IFC::Schema_2x3::IfcRepresentation_const*,std::allocator<Assimp::IFC::Schema_2x3::IfcRepresentation_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::RateRepresentationPredicate>>
                (repr_ordered.
                 super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 repr_ordered.
                 super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar19 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Assimp::IFC::Schema_2x3::IfcRepresentation_const**,std::vector<Assimp::IFC::Schema_2x3::IfcRepresentation_const*,std::allocator<Assimp::IFC::Schema_2x3::IfcRepresentation_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::RateRepresentationPredicate>>
                  (ppIVar12,ppIVar6);
      }
      else {
        ppIVar22 = ppIVar12 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Assimp::IFC::Schema_2x3::IfcRepresentation_const**,std::vector<Assimp::IFC::Schema_2x3::IfcRepresentation_const*,std::allocator<Assimp::IFC::Schema_2x3::IfcRepresentation_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::RateRepresentationPredicate>>
                  (ppIVar12,ppIVar22);
        for (; ppIVar22 != ppIVar6; ppIVar22 = ppIVar22 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Assimp::IFC::Schema_2x3::IfcRepresentation_const**,std::vector<Assimp::IFC::Schema_2x3::IfcRepresentation_const*,std::allocator<Assimp::IFC::Schema_2x3::IfcRepresentation_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::RateRepresentationPredicate>>
                    (ppIVar22);
        }
      }
    }
    ppIVar12 = repr_ordered.
               super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (ppIVar12 ==
          repr_ordered.
          super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) break;
      pLVar1 = (Lazy *)((*ppIVar12)->Items).
                       super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                       .
                       super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
      bVar17 = 0;
      for (this_03 = (Lazy *)((*ppIVar12)->Items).
                             super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                             .
                             super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; this_03 != pLVar1;
          this_03 = this_03 + 8) {
        pIVar13 = (IFC *)Assimp::STEP::Lazy::operator_cast_to_IfcRepresentationItem_(this_03);
        pIVar14 = Assimp::STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcMappedItem>
                            ((Object *)(pIVar13 + *(long *)(*(long *)pIVar13 + -0x18)));
        if (pIVar14 == (IfcMappedItem *)0x0) {
          bVar23 = Assimp::IFC::ProcessRepresentationItem
                             (pIVar13,(IfcRepresentationItem *)(ulong)prevMatId,(uint)&meshes,
                              (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)subnodes,conv);
          bVar17 = bVar17 | bVar23;
        }
        else {
          this_02.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
          super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
          super__Head_base<0UL,_aiNode_*,_false>._M_head_impl =
               (__uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>)operator_new(0x478);
          aiNode::aiNode((aiNode *)
                         this_02.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                         super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                         super__Head_base<0UL,_aiNode_*,_false>._M_head_impl);
          nd_1._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
          super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
          super__Head_base<0UL,_aiNode_*,_false>._M_head_impl =
               (__uniq_ptr_data<aiNode,_std::default_delete<aiNode>,_true,_true>)
               (__uniq_ptr_data<aiNode,_std::default_delete<aiNode>,_true,_true>)
               this_02.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
               super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
               super__Head_base<0UL,_aiNode_*,_false>._M_head_impl;
          aiString::Set((aiString *)
                        this_02.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                        super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                        super__Head_base<0UL,_aiNode_*,_false>._M_head_impl,"IfcMappedItem");
          m.a1 = 1.0;
          m.a4 = 0.0;
          m.b1 = 0.0;
          m.a2 = 0.0;
          m.a3 = 0.0;
          m.b2 = 1.0;
          m.c1 = 0.0;
          m.c2 = 0.0;
          m.b3 = 0.0;
          m.b4 = 0.0;
          m.c3 = 1.0;
          m.d2 = 0.0;
          m.d3 = 0.0;
          m.c4 = 0.0;
          m.d1 = 0.0;
          m.d4 = 1.0;
          op = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator>::
               operator*((Lazy<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator> *)
                         &(pIVar14->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMappedItem,_2UL>)
                          .field_0x18);
          Assimp::IFC::ConvertTransformOperator(&m,op);
          msrc.a1 = 1.0;
          msrc.a4 = 0.0;
          msrc.b1 = 0.0;
          msrc.a2 = 0.0;
          msrc.a3 = 0.0;
          msrc.b2 = 1.0;
          msrc.c1 = 0.0;
          msrc.c2 = 0.0;
          msrc.b3 = 0.0;
          msrc.b4 = 0.0;
          msrc.c3 = 1.0;
          msrc.d2 = 0.0;
          msrc.d3 = 0.0;
          msrc.c4 = 0.0;
          msrc.d1 = 0.0;
          msrc.d4 = 1.0;
          this_00 = &(pIVar14->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMappedItem,_2UL>).
                     field_0x10;
          pIVar15 = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationMap>::operator->
                              ((Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationMap> *)this_00);
          Assimp::IFC::ConvertAxisPlacement
                    (&msrc,*(IfcAxis2Placement **)
                            &(pIVar15->
                             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationMap,_2UL>)
                             .field_0x10,(ConversionData *)subnodes);
          lVar18 = 0x10;
          pIVar21 = &m;
          paVar20 = &temp;
          for (lVar19 = lVar18; lVar19 != 0; lVar19 = lVar19 + -1) {
            paVar20->a1 = pIVar21->a1;
            pIVar21 = (IfcMatrix4 *)((long)pIVar21 + (ulong)bVar24 * -0x10 + 8);
            paVar20 = (aiMatrix4x4t<double> *)((long)paVar20 + (ulong)bVar24 * -0x10 + 8);
          }
          aiMatrix4x4t<double>::operator*=(&temp,&msrc);
          paVar20 = &temp;
          pIVar21 = &msrc;
          for (; lVar18 != 0; lVar18 = lVar18 + -1) {
            pIVar21->a1 = paVar20->a1;
            paVar20 = (aiMatrix4x4t<double> *)((long)paVar20 + (ulong)bVar24 * -0x10 + 8);
            pIVar21 = (IfcMatrix4 *)((long)pIVar21 + (ulong)bVar24 * -0x10 + 8);
          }
          meshes_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          meshes_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          meshes_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &meshes_1._M_t._M_impl.super__Rb_tree_header._M_header;
          meshes_1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          ppaVar2 = subnodes[0xe].super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (ppaVar2 == (pointer)0x0) {
            local_3e0 = 0;
          }
          else {
            local_3e0 = ((long)ppaVar2[1] - (long)*ppaVar2) / 0x58;
          }
          meshes_1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               meshes_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          if (subnodes[0xd].super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            pIVar21 = &msrc;
            paVar20 = &temp;
            for (lVar18 = 0x10; lVar18 != 0; lVar18 = lVar18 + -1) {
              paVar20->a1 = pIVar21->a1;
              pIVar21 = (IfcMatrix4 *)((long)pIVar21 + (ulong)bVar24 * -0x10 + 8);
              paVar20 = (aiMatrix4x4t<double> *)((long)paVar20 + (ulong)bVar24 * -0x10 + 8);
            }
            aiMatrix4x4t<double>::Inverse(&temp);
            ppaVar2 = subnodes[0xd].super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            paVar3 = ppaVar2[1];
            for (this_04 = *ppaVar2; this_04 != paVar3;
                this_04 = (aiNode *)((this_04->mName).data + 0x54)) {
              Assimp::IFC::TempOpening::Transform((TempOpening *)this_04,&temp);
            }
          }
          uVar9 = Assimp::IFC::ProcessMaterials
                            (*(uint64_t *)
                              (&pIVar14->field_0x8 + *(long *)(*(long *)pIVar14 + -0x18)),prevMatId,
                             (ConversionData *)subnodes,false);
          pIVar15 = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationMap>::operator->
                              ((Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationMap> *)this_00);
          pIVar16 = Assimp::STEP::Lazy::operator_cast_to_IfcRepresentation_
                              ((Lazy *)&(pIVar15->
                                        super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationMap,_2UL>
                                        ).field_0x20);
          pLVar4 = (Lazy *)(pIVar16->Items).
                           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                           .
                           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
          bVar23 = false;
          for (this_05 = (Lazy *)(pIVar16->Items).
                                 super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                                 .
                                 super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start; this_05 != pLVar4;
              this_05 = this_05 + 8) {
            pIVar13 = (IFC *)Assimp::STEP::Lazy::operator_cast_to_IfcRepresentationItem_(this_05);
            bVar8 = Assimp::IFC::ProcessRepresentationItem
                              (pIVar13,(IfcRepresentationItem *)(ulong)uVar9,(uint)&meshes_1,
                               (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                *)subnodes,conv);
            bVar7 = true;
            if (!bVar8) {
              Assimp::STEP::Object::GetClassName_abi_cxx11_
                        (&local_328,(Object *)(pIVar13 + *(long *)(*(long *)pIVar13 + -0x18)));
              std::operator+(&local_308,"skipping mapped entity of type ",&local_328);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_1e8,&local_308,", no representations could be generated");
              Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              basic_formatter<std::__cxx11::string>
                        ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&temp,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1e8);
              Assimp::LogFunctions<Assimp::IFCImporter>::LogWarn((format *)&temp);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&temp);
              std::__cxx11::string::~string((string *)&local_1e8);
              std::__cxx11::string::~string((string *)&local_308);
              std::__cxx11::string::~string((string *)&local_328);
              bVar7 = bVar23;
            }
            bVar23 = bVar7;
          }
          if (bVar23) {
            Assimp::IFC::AssignAddedMeshes
                      (&meshes_1,
                       (aiNode *)
                       nd_1._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                       super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                       super__Head_base<0UL,_aiNode_*,_false>._M_head_impl,
                       (ConversionData *)subnodes);
            ppaVar2 = subnodes[0xe].super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (ppaVar2 != (pointer)0x0) {
              lVar18 = ((long)ppaVar2[1] - (long)*ppaVar2) / 0x58 - local_3e0;
              if (lVar18 != 0) {
                local_3e0 = local_3e0 * 0x58;
                while (bVar23 = lVar18 != 0, lVar18 = lVar18 + -1, bVar23) {
                  Assimp::IFC::TempOpening::Transform
                            ((TempOpening *)
                             (((*subnodes[0xe].
                                 super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                                 super__Vector_impl_data._M_start)->mName).data + local_3e0 + -4),
                             &msrc);
                  local_3e0 = local_3e0 + 0x58;
                }
              }
            }
            aiMatrix4x4t::operator_cast_to_aiMatrix4x4t(&msrc);
            temp.a1 = *(double *)
                       &el[3].super_IfcObject.
                        super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x24;
            temp.a2 = *(double *)&el[3].super_IfcObject.field_0xc4;
            temp.a3 = *(double *)&el[3].super_IfcObject.field_0xcc;
            temp.a4 = *(double *)&el[3].super_IfcObject.field_0xd4;
            temp.b1 = *(double *)&el[3].super_IfcObject.field_0xdc;
            temp.b2 = *(double *)&el[3].super_IfcObject.field_0xe4;
            temp.b3 = *(double *)&el[3].field_0xec;
            temp.b4 = *(double *)((long)&el[3].Representation.ptr.obj + 4);
            aiMatrix4x4t<float>::operator*=((aiMatrix4x4t<float> *)&temp,&local_1e8);
            uVar5 = nd_1;
            *(double *)
             ((long)nd_1._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                    super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x434) = temp.b3;
            *(double *)
             ((long)nd_1._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                    super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x43c) = temp.b4;
            *(double *)
             ((long)nd_1._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                    super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x424) = temp.b1;
            *(double *)
             ((long)nd_1._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                    super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x42c) = temp.b2;
            *(double *)
             ((long)nd_1._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                    super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x414) = temp.a3;
            *(double *)
             ((long)nd_1._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                    super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x41c) = temp.a4;
            *(double *)
             ((long)nd_1._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                    super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x404) = temp.a1;
            *(double *)
             ((long)nd_1._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                    super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x40c) = temp.a2;
            nd_1._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
            super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
            super__Head_base<0UL,_aiNode_*,_false>._M_head_impl =
                 (__uniq_ptr_data<aiNode,_std::default_delete<aiNode>,_true,_true>)
                 (__uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>)0x0;
            temp.a1 = (double)uVar5._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>
                              ._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                              super__Head_base<0UL,_aiNode_*,_false>._M_head_impl;
            std::vector<aiNode*,std::allocator<aiNode*>>::emplace_back<aiNode*>
                      ((vector<aiNode*,std::allocator<aiNode*>> *)nd,(aiNode **)&temp);
            bVar17 = 1;
          }
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree(&meshes_1._M_t);
          std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::~unique_ptr(&nd_1);
        }
      }
      ppIVar12 = ppIVar12 + 1;
    } while (bVar17 == 0);
    Assimp::IFC::AssignAddedMeshes(&meshes,(aiNode *)el,(ConversionData *)subnodes);
    std::
    _Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
    ::~_Vector_base(&repr_ordered.
                     super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                   );
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&meshes._M_t);
  }
  return;
}

Assistant:

void ProcessProductRepresentation(const Schema_2x3::IfcProduct& el, aiNode* nd, std::vector< aiNode* >& subnodes, ConversionData& conv)
{
    if(!el.Representation) {
        return;
    }

    // extract Color from metadata, if present
    unsigned int matid = ProcessMaterials( el.GetID(), std::numeric_limits<uint32_t>::max(), conv, false);
    std::set<unsigned int> meshes;

    // we want only one representation type, so bring them in a suitable order (i.e try those
    // that look as if we could read them quickly at first). This way of reading
    // representation is relatively generic and allows the concrete implementations
    // for the different representation types to make some sensible choices what
    // to load and what not to load.
    const STEP::ListOf< STEP::Lazy< Schema_2x3::IfcRepresentation >, 1, 0 >& src = el.Representation.Get()->Representations;
    std::vector<const Schema_2x3::IfcRepresentation*> repr_ordered(src.size());
    std::copy(src.begin(),src.end(),repr_ordered.begin());
    std::sort(repr_ordered.begin(),repr_ordered.end(),RateRepresentationPredicate());
    for(const Schema_2x3::IfcRepresentation* repr : repr_ordered) {
        bool res = false;
        for(const Schema_2x3::IfcRepresentationItem& item : repr->Items) {
            if(const Schema_2x3::IfcMappedItem* const geo = item.ToPtr<Schema_2x3::IfcMappedItem>()) {
                res = ProcessMappedItem(*geo,nd,subnodes,matid,conv) || res;
            }
            else {
                res = ProcessRepresentationItem(item,matid,meshes,conv) || res;
            }
        }
        // if we got something meaningful at this point, skip any further representations
        if(res) {
            break;
        }
    }
    AssignAddedMeshes(meshes,nd,conv);
}